

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBoxPrivate::keyboardSearchString(QComboBoxPrivate *this,QString *text)

{
  QAbstractItemView *this_00;
  int iVar1;
  QComboBoxPrivateContainer *pQVar2;
  long in_FS_OFFSET;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = viewContainer(this);
  this_00 = (QAbstractItemView *)pQVar2->view;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_50,&this->currentIndex);
  QAbstractItemView::setCurrentIndex(this_00,&local_50);
  QAbstractItemView::currentIndex(&local_50,this_00);
  iVar1 = local_50.r;
  (**(code **)(*(long *)this_00 + 0x1d8))(this_00,text);
  QAbstractItemView::currentIndex(&local_50,this_00);
  if (iVar1 != local_50.r) {
    QAbstractItemView::currentIndex(&local_50,this_00);
    setCurrentIndex(this,&local_50);
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_50,&this->currentIndex);
    emitActivated(this,&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::keyboardSearchString(const QString &text)
{
    // use keyboardSearch from the listView so we do not duplicate code
    QAbstractItemView *view = viewContainer()->itemView();
    view->setCurrentIndex(currentIndex);
    int currentRow = view->currentIndex().row();
    view->keyboardSearch(text);
    if (currentRow != view->currentIndex().row()) {
        setCurrentIndex(view->currentIndex());
        emitActivated(currentIndex);
    }
}